

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O3

BOOL VirtualFreeEnclosing_
               (LPVOID lpRegionStartAddress,SIZE_T dwSize,SIZE_T dwAlignmentSize,
               LPVOID lpActualAlignedStartAddress)

{
  byte bVar1;
  int iVar2;
  CPalThread *pThread;
  PCMI pInformation;
  int *piVar3;
  BYTE *pBVar4;
  BYTE *pvMem;
  undefined8 uVar5;
  size_t __len;
  BOOL BVar6;
  size_t szSize;
  
  __len = (long)lpActualAlignedStartAddress - (long)lpRegionStartAddress;
  if (lpActualAlignedStartAddress < lpRegionStartAddress) {
    fprintf(_stderr,"] %s %s:%d","VirtualFreeEnclosing_",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
            ,0x714);
    fprintf(_stderr,"Expression: lpActualAlignedStartAddress >= lpRegionStartAddress\n");
  }
  if ((LPVOID)((long)lpRegionStartAddress + dwAlignmentSize + dwSize) <= lpActualAlignedStartAddress
     ) {
    fprintf(_stderr,"] %s %s:%d","VirtualFreeEnclosing_",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
            ,0x715);
    fprintf(_stderr,
            "Expression: lpActualAlignedStartAddress < (char*)lpRegionStartAddress + dwSize + dwAlignmentSize\n"
           );
  }
  if (__len != dwAlignmentSize - (ulong)lpRegionStartAddress % dwAlignmentSize) {
    fprintf(_stderr,"] %s %s:%d","VirtualFreeEnclosing_",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
            ,0x725);
    fprintf(_stderr,"Expression: beforeRegionSize == beforeRegionSize2\n");
  }
  pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pThread == (CPalThread *)0x0) {
    pThread = CreateCurrentThreadData();
  }
  if (dwSize == 0) {
    if (PAL_InitializeChakraCoreCalled != false) {
      piVar3 = __errno_location();
      *piVar3 = 0x57;
      return 0;
    }
    goto LAB_001d3605;
  }
  CorUnix::InternalEnterCriticalSection(pThread,&virtual_critsec);
  pInformation = VIRTUALFindRegionInformation((UINT_PTR)lpRegionStartAddress);
  if (pInformation == (PCMI)0x0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d3605;
    piVar3 = __errno_location();
    *piVar3 = 0x1e7;
  }
  else {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d3605;
    iVar2 = munmap(lpRegionStartAddress,__len);
    if (iVar2 != 0) {
      uVar5 = 0x751;
LAB_001d3400:
      BVar6 = 0;
      fprintf(_stderr,"] %s %s:%d","VirtualFreeEnclosing_",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
              ,uVar5);
      fprintf(_stderr,"Unable to unmap the memory, munmap() returned an abnormal value.\n");
      piVar3 = __errno_location();
      *piVar3 = 0x54f;
      goto LAB_001d345b;
    }
    if (dwAlignmentSize != __len) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d3605;
      iVar2 = munmap((void *)((long)lpActualAlignedStartAddress + dwSize),dwAlignmentSize - __len);
      if (iVar2 != 0) {
        uVar5 = 0x76b;
        goto LAB_001d3400;
      }
    }
    if ((dwSize & 0xfff) != 0) {
      BVar6 = 0;
      if (PAL_InitializeChakraCoreCalled == false) {
LAB_001d3605:
        abort();
      }
      goto LAB_001d345b;
    }
    pInformation->startBoundary = (UINT_PTR)lpActualAlignedStartAddress;
    pInformation->memSize = dwSize;
    szSize = ((dwSize >> 0xf) + 1) - (ulong)((dwSize & 0x7000) == 0);
    if (pInformation->pProtectionState != (BYTE *)0x0) {
      CorUnix::InternalFree(pInformation->pProtectionState);
    }
    pInformation->pProtectionState = (BYTE *)0x0;
    if (pInformation->pAllocState != (BYTE *)0x0) {
      CorUnix::InternalFree(pInformation->pAllocState);
    }
    pInformation->pAllocState = (BYTE *)0x0;
    pBVar4 = (BYTE *)CorUnix::InternalMalloc(szSize);
    pInformation->pAllocState = pBVar4;
    pvMem = (BYTE *)CorUnix::InternalMalloc(dwSize >> 0xc);
    pInformation->pProtectionState = pvMem;
    pBVar4 = pInformation->pAllocState;
    if (pvMem != (BYTE *)0x0 && pBVar4 != (BYTE *)0x0) {
      VIRTUALSetAllocState(0x2000,0,szSize * 8,pInformation);
      pBVar4 = pInformation->pProtectionState;
      bVar1 = VIRTUALConvertWinFlags(pInformation->accessProtection);
      memset(pBVar4,(uint)bVar1,dwSize >> 0xc);
      BVar6 = 1;
      goto LAB_001d345b;
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d3605;
    if (pvMem != (BYTE *)0x0) {
      CorUnix::InternalFree(pvMem);
      pBVar4 = pInformation->pAllocState;
    }
    pInformation->pProtectionState = (BYTE *)0x0;
    if (pBVar4 != (BYTE *)0x0) {
      CorUnix::InternalFree(pBVar4);
    }
    pInformation->pAllocState = (BYTE *)0x0;
  }
  BVar6 = 0;
LAB_001d345b:
  CorUnix::InternalLeaveCriticalSection(pThread,&virtual_critsec);
  return BVar6;
}

Assistant:

BOOL
VirtualFreeEnclosing_(
    IN LPVOID lpRegionStartAddress,         /* Starting address of the original region. */
    IN SIZE_T dwSize,                       /* Size of the requested region i.e. the intended size of the VirtualAlloc call.*/
    IN SIZE_T dwAlignmentSize,              /* The intended alignment of the returned address. This is also the size of the extra memory reserved i.e. 64KB in our case whenw e try a 64K alignment. */
    IN LPVOID lpActualAlignedStartAddress)  /* Actual starting address that will be returned for the new allocation. */
{
    BOOL bRetVal = TRUE;

#ifdef DEBUG
    _ASSERTE(lpActualAlignedStartAddress >= lpRegionStartAddress);
    _ASSERTE(lpActualAlignedStartAddress < (char*)lpRegionStartAddress + dwSize + dwAlignmentSize);
#endif

    char * beforeRegionStart = (char *) lpRegionStartAddress;
    size_t beforeRegionSize = (char *) lpActualAlignedStartAddress - beforeRegionStart;
    char * afterRegionStart = (char *) lpActualAlignedStartAddress + dwSize;
    size_t afterRegionSize = dwAlignmentSize - beforeRegionSize;

    bool beforeRegionFreed = false;
    bool afterRegionFreed = (afterRegionSize == 0);

#ifdef DEBUG
    _ASSERTE(dwSize + dwAlignmentSize == beforeRegionSize + dwSize + afterRegionSize);

    SIZE_T alignmentDiff = ((ULONG_PTR)lpRegionStartAddress % dwAlignmentSize);
    size_t beforeRegionSize2 = dwAlignmentSize - alignmentDiff;
    _ASSERTE(beforeRegionSize == beforeRegionSize2);
#endif

    CPalThread *pthrCurrent;
    pthrCurrent = InternalGetCurrentThread();

    if (dwSize == 0)
    {
        ERROR("dwSize must be non-zero when releasing enclosing memory region.\n");
        pthrCurrent->SetLastError(ERROR_INVALID_PARAMETER);
        return FALSE;
    }

    InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);

    PCMI pMemoryToBeReleased =
        VIRTUALFindRegionInformation((UINT_PTR)lpRegionStartAddress);

    if (!pMemoryToBeReleased)
    {
        ERROR("lpRegionStartAddress must be the base address returned by VirtualAlloc.\n");
        pthrCurrent->SetLastError(ERROR_INVALID_ADDRESS);
        bRetVal = FALSE;
        goto VirtualFreeEnclosingExit;
    }

    TRACE("Releasing the following memory %d to %d.\n", beforeRegionStart, beforeRegionSize);

#if (MMAP_IGNORES_HINT && !MMAP_DOESNOT_ALLOW_REMAP)
    if (mmap((void *)beforeRegionStart, beforeRegionSize, PROT_NONE, MAP_FIXED | MAP_PRIVATE, gBackingFile,
        (char *)beforeRegionStart - (char *)gBackingBaseAddress) != MAP_FAILED)
#else   // MMAP_IGNORES_HINT && !MMAP_DOESNOT_ALLOW_REMAP
    if (munmap((LPVOID)beforeRegionStart, beforeRegionSize) == 0)
#endif  // MMAP_IGNORES_HINT && !MMAP_DOESNOT_ALLOW_REMAP
    {
        beforeRegionFreed = true;
    }
    else
    {
#if MMAP_IGNORES_HINT
        ASSERT("Unable to remap the memory onto the backing file; "
            "error is %d.\n", errno);
#else   // MMAP_IGNORES_HINT
        ASSERT("Unable to unmap the memory, munmap() returned "
            "an abnormal value.\n");
#endif  // MMAP_IGNORES_HINT
        pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
        bRetVal = FALSE;
        goto VirtualFreeEnclosingExit;
    }